

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
* __thiscall
PSEngine::get_absolute_directions_from_rule_direction
          (set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
           *__return_storage_ptr__,PSEngine *this,RuleDirection p_rule_direction)

{
  pair<std::_Rb_tree_const_iterator<PSEngine::AbsoluteDirection>,_bool> pVar1;
  value_type local_13c;
  _Base_ptr local_138;
  undefined1 local_130;
  value_type local_124;
  _Base_ptr local_120;
  undefined1 local_118;
  value_type local_10c;
  _Base_ptr local_108;
  undefined1 local_100;
  value_type local_f4 [6];
  value_type local_dc;
  _Base_ptr local_d8;
  undefined1 local_d0;
  value_type local_c4 [6];
  value_type local_ac;
  _Base_ptr local_a8;
  undefined1 local_a0;
  value_type local_94 [6];
  value_type local_7c [6];
  value_type local_64 [6];
  value_type local_4c [10];
  value_type local_24;
  undefined1 local_1d;
  RuleDirection local_1c;
  PSEngine *pPStack_18;
  RuleDirection p_rule_direction_local;
  PSEngine *this_local;
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  *results;
  
  local_1d = 0;
  local_1c = p_rule_direction;
  pPStack_18 = this;
  this_local = (PSEngine *)__return_storage_ptr__;
  std::
  set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
  ::set(__return_storage_ptr__);
  switch(local_1c) {
  case Up:
    local_24 = Up;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,&local_24);
    break;
  case Down:
    local_4c[0] = Down;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,local_4c);
    break;
  case Left:
    local_64[0] = Left;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,local_64);
    break;
  case Right:
    local_7c[0] = Right;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,local_7c);
    break;
  case Horizontal:
    local_94[0] = Left;
    pVar1 = std::
            set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
            ::insert(__return_storage_ptr__,local_94);
    local_a8 = (_Base_ptr)pVar1.first._M_node;
    local_a0 = pVar1.second;
    local_ac = Right;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,&local_ac);
    break;
  case Vertical:
    local_c4[0] = Up;
    pVar1 = std::
            set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
            ::insert(__return_storage_ptr__,local_c4);
    local_d8 = (_Base_ptr)pVar1.first._M_node;
    local_d0 = pVar1.second;
    local_dc = Down;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,&local_dc);
    break;
  default:
    local_f4[0] = Up;
    pVar1 = std::
            set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
            ::insert(__return_storage_ptr__,local_f4);
    local_108 = (_Base_ptr)pVar1.first._M_node;
    local_100 = pVar1.second;
    local_10c = Down;
    pVar1 = std::
            set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
            ::insert(__return_storage_ptr__,&local_10c);
    local_120 = (_Base_ptr)pVar1.first._M_node;
    local_118 = pVar1.second;
    local_124 = Left;
    pVar1 = std::
            set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
            ::insert(__return_storage_ptr__,&local_124);
    local_138 = (_Base_ptr)pVar1.first._M_node;
    local_130 = pVar1.second;
    local_13c = Right;
    std::
    set<PSEngine::AbsoluteDirection,_std::less<PSEngine::AbsoluteDirection>,_std::allocator<PSEngine::AbsoluteDirection>_>
    ::insert(__return_storage_ptr__,&local_13c);
  }
  return __return_storage_ptr__;
}

Assistant:

set<PSEngine::AbsoluteDirection> PSEngine::get_absolute_directions_from_rule_direction(CompiledGame::RuleDirection p_rule_direction)
{
    set<AbsoluteDirection> results;
    switch (p_rule_direction)
    {
    case CompiledGame::RuleDirection::Up:
        results.insert(AbsoluteDirection::Up);
        break;
    case CompiledGame::RuleDirection::Down:
        results.insert(AbsoluteDirection::Down);
        break;
    case CompiledGame::RuleDirection::Left:
        results.insert(AbsoluteDirection::Left);
        break;
    case CompiledGame::RuleDirection::Right:
        results.insert(AbsoluteDirection::Right);
        break;
    case CompiledGame::RuleDirection::Horizontal:
        results.insert(AbsoluteDirection::Left);
        results.insert(AbsoluteDirection::Right);
        break;
    case CompiledGame::RuleDirection::Vertical:
        results.insert(AbsoluteDirection::Up);
        results.insert(AbsoluteDirection::Down);
        break;
    default:
        results.insert(AbsoluteDirection::Up);
        results.insert(AbsoluteDirection::Down);
        results.insert(AbsoluteDirection::Left);
        results.insert(AbsoluteDirection::Right);
        break;
    }

    return results;
}